

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

void __thiscall ConfigReader::error(ConfigReader *this,string *errstr)

{
  ostream *poVar1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *errstr_local;
  ConfigReader *this_local;
  
  local_18 = errstr;
  errstr_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_lineNum);
  poVar1 = std::operator<<(poVar1," : ");
  std::operator<<(poVar1,(string *)local_18);
  std::__cxx11::stringstream::str();
  doLog(8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void ConfigReader::error(const std::string &errstr)
{
    std::stringstream ss;
    ss << "Line " << m_lineNum << " : " << errstr; 
    doLog(LOG_ERROR, ss.str());
}